

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O2

Hop_Obj_t * Abc_NtkMfsInterplate(Mfs_Man_t *p,int *pCands,int nCands)

{
  int iVar1;
  sat_solver *s;
  Sto_Man_t *pCnf;
  int *piVar2;
  Kit_Graph_t *pGraph;
  Hop_Obj_t *pHVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puTruth;
  uint *local_38;
  
  uVar4 = 0;
  s = Abc_MfsCreateSolverResub(p,pCands,nCands,0);
  iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar1 == -1) {
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    piVar2 = Int_ManSetGlobalVars(p->pMan,nCands);
    uVar5 = 0;
    if (0 < nCands) {
      uVar5 = (ulong)(uint)nCands;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar1 = Vec_IntEntry(p->vProjVarsCnf,(pCands[uVar4] >> 1) + p->pCnf->nVars * -2);
      piVar2[uVar4] = iVar1;
    }
    iVar1 = Int_ManInterpolate(p->pMan,pCnf,0,&local_38);
    Sto_ManFree(pCnf);
    if (iVar1 != nCands) {
      __assert_fail("nFanins == nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsInter.c"
                    ,0x17f,"Hop_Obj_t *Abc_NtkMfsInterplate(Mfs_Man_t *, int *, int)");
    }
    pGraph = Kit_TruthToGraph(local_38,nCands,p->vMem);
    pHVar3 = Kit_GraphToHop((Hop_Man_t *)p->pNtk->pManFunc,pGraph);
    Kit_GraphFree(pGraph);
  }
  else {
    p->nTimeOuts = p->nTimeOuts + 1;
    pHVar3 = (Hop_Obj_t *)0x0;
  }
  return pHVar3;
}

Assistant:

Hop_Obj_t * Abc_NtkMfsInterplate( Mfs_Man_t * p, int * pCands, int nCands )
{
    extern Hop_Obj_t * Kit_GraphToHop( Hop_Man_t * pMan, Kit_Graph_t * pGraph );
    int fDumpFile = 0;
    char FileName[32];
    sat_solver * pSat;
    Sto_Man_t * pCnf = NULL;
    unsigned * puTruth;
    Kit_Graph_t * pGraph;
    Hop_Obj_t * pFunc;
    int nFanins, status;
    int c, i, * pGloVars;
//    abctime clk = Abc_Clock();
//    p->nDcMints += Abc_NtkMfsInterplateEval( p, pCands, nCands );

    // derive the SAT solver for interpolation
    pSat = Abc_MfsCreateSolverResub( p, pCands, nCands, 0 );

    // dump CNF file (remember to uncomment two-lit clases in clause_create_new() in 'satSolver.c')
    if ( fDumpFile )
    {
        static int Counter = 0;
        sprintf( FileName, "cnf\\pj1_if6_mfs%03d.cnf", Counter++ );
        Sat_SolverWriteDimacs( pSat, FileName, NULL, NULL, 1 );
    }

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( fDumpFile )
        printf( "File %s has UNSAT problem with %d conflicts.\n", FileName, (int)pSat->stats.conflicts );
    if ( status != l_False )
    {
        p->nTimeOuts++;
        return NULL;
    }
//printf( "%d\n", pSat->stats.conflicts );
//    ABC_PRT( "S", Abc_Clock() - clk );
    // get the learned clauses
    pCnf = (Sto_Man_t *)sat_solver_store_release( pSat );
    sat_solver_delete( pSat );

    // set the global variables
    pGloVars = Int_ManSetGlobalVars( p->pMan, nCands );
    for ( c = 0; c < nCands; c++ )
    {
        // get the variable number of this divisor
        i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
        // get the corresponding SAT variable
        pGloVars[c] = Vec_IntEntry( p->vProjVarsCnf, i );
    }

    // derive the interpolant
    nFanins = Int_ManInterpolate( p->pMan, pCnf, 0, &puTruth );
    Sto_ManFree( pCnf );
    assert( nFanins == nCands );

    // transform interpolant into AIG
    pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );
    pFunc = Kit_GraphToHop( (Hop_Man_t *)p->pNtk->pManFunc, pGraph );
    Kit_GraphFree( pGraph );
    return pFunc;
}